

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O2

string * __thiscall
InvalidFormatAsStopSequenceException::Message_abi_cxx11_
          (string *__return_storage_ptr__,InvalidFormatAsStopSequenceException *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Wrong STOP Value found: ");
  BmsWord::ToString_abi_cxx11_(&local_1c0,&this->word);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," = ");
  std::operator<<(poVar1,(string *)&this->value);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string
InvalidFormatAsStopSequenceException::Message(void) const
{
	std::stringstream ss;
	ss << "Wrong STOP Value found: " << word.ToString() << " = " << value;
	return ss.str();
}